

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest4::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest4 *this,_shader_stage *shader_stage,
          uint *n_subroutine_types,_test_case *test_case)

{
  uint uVar1;
  ostream *poVar2;
  TestError *pTVar3;
  _test_case local_1cc;
  uint local_1c8;
  uint n_subroutine_type_1;
  uint n_subroutine_type;
  stringstream local_1b8 [8];
  stringstream result_sstream;
  ostream local_1a8;
  _test_case *local_30;
  _test_case *test_case_local;
  uint *n_subroutine_types_local;
  _shader_stage *shader_stage_local;
  NegativeTest4 *this_local;
  
  local_30 = test_case;
  test_case_local = n_subroutine_types;
  n_subroutine_types_local = shader_stage;
  shader_stage_local = (_shader_stage *)this;
  this_local = (NegativeTest4 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(&local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n");
  uVar1 = *n_subroutine_types_local;
  if (uVar1 == 1) {
    std::operator<<(&local_1a8,"layout (vertices = 4) out;\n\n");
  }
  else if (uVar1 == 2) {
    std::operator<<(&local_1a8,"layout (quads) in;\n\n");
  }
  else if (uVar1 == 3) {
    std::operator<<(&local_1a8,"layout (points) in;\nlayout (points, max_vertices = 1) out;\n\n");
  }
  for (local_1c8 = 0; local_1c8 < *test_case_local - TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST;
      local_1c8 = local_1c8 + 1) {
    poVar2 = std::operator<<(&local_1a8,"subroutine void subroutineType");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c8);
    std::operator<<(poVar2,"(inout vec3 argument);\n");
  }
  if (*local_30 == TEST_CASE_FIRST) {
    poVar2 = std::operator<<(&local_1a8,"subroutine int subroutineType");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*test_case_local - TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST);
    std::operator<<(poVar2,"(inout vec3 argument);\n");
  }
  else {
    if (*local_30 != TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized test case",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2e3b);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    poVar2 = std::operator<<(&local_1a8,"subroutine void subroutineType");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*test_case_local - TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST);
    std::operator<<(poVar2,"(inout vec3 argument, out vec4 argument2);\n");
  }
  std::operator<<(&local_1a8,"subroutine(");
  for (local_1cc = TEST_CASE_FIRST; local_1cc < *test_case_local;
      local_1cc = local_1cc + TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST) {
    poVar2 = std::operator<<(&local_1a8,"subroutineType");
    std::ostream::operator<<(poVar2,local_1cc);
    if (local_1cc != *test_case_local - TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST) {
      std::operator<<(&local_1a8,", ");
    }
  }
  std::operator<<(&local_1a8,
                  ") void function(inout vec3 argument)\n{\n    argument = vec3(1, 2, 3);\n}\n\n");
  switch(*n_subroutine_types_local) {
  case 0:
  case 2:
    std::operator<<(&local_1a8,"void main()\n{\n    gl_Position = vec4(1, 2, 3, 4);\n}\n");
    break;
  case 1:
    std::operator<<(&local_1a8,
                    "void main()\n{\n    gl_TessLevelInner[0]                = 1;\n    gl_TessLevelInner[1]                = 1;\n    gl_TessLevelOuter[0]                = 1;\n    gl_TessLevelOuter[1]                = 1;\n    gl_TessLevelOuter[2]                = 1;\n    gl_TessLevelOuter[3]                = 1;\n    gl_out[gl_InvocationID].gl_Position = vec4(2, 3, 4, 5);\n}\n"
                   );
    break;
  case 3:
    std::operator<<(&local_1a8,
                    "void main()\n{\n    gl_Position = vec4(1, 2, 3, 4);\n    EmitVertex();\n}\n");
    break;
  case 4:
    std::operator<<(&local_1a8,
                    "out vec4 result;\n\nvoid main()\n{\n    result = vec4(1, 2, 3, 4);\n}\n");
    break;
  default:
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Unrecognized shader stage",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x2e89);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest4::getShaderBody(const Utils::_shader_stage& shader_stage,
										 const unsigned int& n_subroutine_types, const _test_case& test_case) const
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	/* Inject stage-specific code */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "layout (points) in;\n"
						  "layout (points, max_vertices = 1) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "layout (vertices = 4) out;\n"
						  "\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "layout (quads) in;\n"
						  "\n";

		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	/* Insert subroutine type declarations */
	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types - 1; ++n_subroutine_type)
	{
		result_sstream << "subroutine void subroutineType" << n_subroutine_type << "(inout vec3 argument);\n";
	} /* for (all subroutine types) */

	switch (test_case)
	{
	case TEST_CASE_INCOMPATIBLE_ARGUMENT_LIST:
	{
		result_sstream << "subroutine void subroutineType" << (n_subroutine_types - 1)
					   << "(inout vec3 argument, out vec4 argument2);\n";

		break;
	}

	case TEST_CASE_INCOMPATIBLE_RETURN_TYPE:
	{
		result_sstream << "subroutine int subroutineType" << (n_subroutine_types - 1) << "(inout vec3 argument);\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized test case");
	}
	} /* switch (test_case) */

	/* Insert subroutine declarations */
	result_sstream << "subroutine(";

	for (unsigned int n_subroutine_type = 0; n_subroutine_type < n_subroutine_types; ++n_subroutine_type)
	{
		result_sstream << "subroutineType" << n_subroutine_type;

		if (n_subroutine_type != (n_subroutine_types - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all subroutine types) */

	result_sstream << ") void function(inout vec3 argument)\n"
					  "{\n"
					  "    argument = vec3(1, 2, 3);\n"
					  "}\n"
					  "\n";

	/* Insert remaining required stage-specific bits */
	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result_sstream << "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "    EmitVertex();\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_TessLevelInner[0]                = 1;\n"
						  "    gl_TessLevelInner[1]                = 1;\n"
						  "    gl_TessLevelOuter[0]                = 1;\n"
						  "    gl_TessLevelOuter[1]                = 1;\n"
						  "    gl_TessLevelOuter[2]                = 1;\n"
						  "    gl_TessLevelOuter[3]                = 1;\n"
						  "    gl_out[gl_InvocationID].gl_Position = vec4(2, 3, 4, 5);\n"
						  "}\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	case Utils::SHADER_STAGE_VERTEX:
	{
		result_sstream << "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1, 2, 3, 4);\n"
						  "}\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized shader stage");
	}
	} /* switch (shader_stage) */

	return result_sstream.str();
}